

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O1

bool __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::scan
          (Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *this)

{
  const_iterator item_it;
  char *pcVar1;
  pointer pCVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  
  std::
  vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
  ::resize(&this->props_,
           (long)(this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start);
  pcVar1 = (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar3 = (this->item_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar1 != pcVar3) {
    pCVar2 = (this->props_).
             super__Vector_base<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::CharProperties>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar4 = pcVar1;
    do {
      pCVar2->uppercase = (byte)(*pcVar4 + 0xbfU) < 0x1a;
      pcVar4 = pcVar4 + 1;
      pCVar2 = pCVar2 + 1;
    } while (pcVar4 != pcVar3);
  }
  if (this->case_sensitive_ != false) {
    pcVar3 = (this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar4 = (this->query_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pcVar3 == pcVar4) {
      bVar5 = true;
    }
    else {
      while ((bVar5 = pcVar1 != (this->item_).super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_finish, bVar5 &&
             ((*pcVar1 != *pcVar3 || (pcVar3 = pcVar3 + 1, pcVar3 != pcVar4))))) {
        pcVar1 = pcVar1 + 1;
      }
    }
    return bVar5;
  }
  bVar5 = scan_match<false>(this);
  return bVar5;
}

Assistant:

bool scan() {
    props_.resize(item_.size());
    auto props_it = props_.begin();
    for (auto item_it = item_.cbegin(), item_last = item_.cend();
         item_it != item_last; ++item_it, ++props_it) {
      props_it->uppercase = StringTraits::is_uppercase(*item_it);
    }
    if (case_sensitive_) {
      return scan_match<true>();
    } else {
      return scan_match<false>();
    }
  }